

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O2

bool __thiscall ON_BoolValue::ReportHelper(ON_BoolValue *this,ON_TextLog *text_log)

{
  uint uVar1;
  ulong uVar2;
  char *format;
  
  uVar1 = (this->m_value).m_count;
  ON_TextLog::Print(text_log,"bool value\n");
  ON_TextLog::PushIndent(text_log);
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    format = "true";
    if ((this->m_value).m_a[uVar2] == false) {
      format = "false";
    }
    ON_TextLog::Print(text_log,format);
  }
  ON_TextLog::PopIndent(text_log);
  return true;
}

Assistant:

bool ON_BoolValue::ReportHelper(ON_TextLog& text_log ) const
{
  int i, count = m_value.Count();
  text_log.Print("bool value\n");
  text_log.PushIndent();
  for ( i = 0; i < count; i++ )
  {
    text_log.Print(m_value[i]?"true":"false");
  }
  text_log.PopIndent();
  return true;
}